

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O0

void QGuiApplicationPrivate::processKeyEvent(KeyEvent *e)

{
  long lVar1;
  EventType EVar2;
  bool bVar3;
  QWindow *device;
  QInputDevice *pQVar4;
  QWindow *pQVar5;
  QWindowPrivate *pQVar6;
  WindowSystemEvent *in_RDI;
  long in_FS_OFFSET;
  QWindow *activePopup;
  QWindow *window;
  ushort in_stack_00000068;
  QKeyEvent ev;
  undefined1 in_stack_ffffffffffffff0f;
  QKeyEvent *this;
  Type in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff24;
  quint32 nativeModifiers;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined2 in_stack_ffffffffffffff50;
  undefined2 uVar9;
  undefined4 in_stack_ffffffffffffff54;
  quint16 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff70;
  quint32 in_stack_ffffffffffffff74;
  quint32 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  ulong in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  QInputEvent local_70;
  QFlagsStorage<Qt::KeyboardModifier> in_stack_ffffffffffffffd4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  device = QPointer<QWindow>::data((QPointer<QWindow> *)0x367481);
  modifier_buttons.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
  super_QFlagsStorage<Qt::KeyboardModifier>.i =
       *(QFlagsStorageHelper<Qt::KeyboardModifier,_4> *)&in_RDI[2]._vptr_WindowSystemEvent;
  bVar3 = QWindowSystemInterfacePrivate::WindowSystemEvent::nullWindow(in_RDI);
  if (bVar3) {
    device = QGuiApplication::focusWindow();
  }
  if (device == (QWindow *)0x0) {
    in_RDI->eventAccepted = false;
    goto LAB_00367716;
  }
  if ((in_RDI[4].flags == 6) &&
     (bVar3 = QWindowSystemInterface::handleShortcutEvent
                        ((QWindow *)
                         CONCAT44(*(undefined4 *)&in_RDI[2]._vptr_WindowSystemEvent,
                                  in_stack_ffffffffffffff88),in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffff7c,(KeyboardModifiers)in_stack_ffffffffffffffd4.i,
                         in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,(quint32)activePopup,
                         (QString *)window,SUB41((uint)in_stack_ffffffffffffff70 >> 0x18,0),
                         in_stack_00000068), bVar3)) goto LAB_00367716;
  memset(&local_70,0xaa,0x58);
  nativeModifiers = in_RDI[4].flags;
  uVar7 = *(undefined4 *)&in_RDI[4].eventAccepted;
  uVar8 = *(undefined4 *)&in_RDI[4].field_0x14;
  this = (QKeyEvent *)&in_RDI[3].type;
  EVar2 = in_RDI[4].type;
  uVar9 = *(undefined2 *)((long)&in_RDI[4].type + 2);
  QString::QString((QString *)0x3675f0);
  pQVar4 = QInputDevice::primaryKeyboard
                     ((QString *)
                      CONCAT44(in_stack_ffffffffffffff54,CONCAT22(uVar9,in_stack_ffffffffffffff50)))
  ;
  QKeyEvent::QKeyEvent
            ((QKeyEvent *)CONCAT44(in_stack_ffffffffffffff24,(uint)(ushort)uVar9),
             in_stack_ffffffffffffff1c,(uint)(byte)((char)EVar2 & 1),
             (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)SUB84((ulong)pQVar4 >> 0x20,0),
             (quint32)((ulong)this >> 0x20),(quint32)this,nativeModifiers,
             (QString *)CONCAT44(uVar8,uVar7),(bool)in_stack_ffffffffffffff0f,
             in_stack_ffffffffffffff58,(QInputDevice *)device);
  QString::~QString((QString *)0x367658);
  QInputEvent::setTimestamp(&local_70,*(quint64 *)&in_RDI[1].eventAccepted);
  pQVar5 = activePopupWindow();
  if ((pQVar5 == (QWindow *)0x0) || (pQVar5 == device)) {
LAB_003676c2:
    pQVar6 = QWindow::d_func((QWindow *)0x3676cc);
    if ((pQVar6->blockedByModalWindow & 1U) == 0) {
      QCoreApplication::sendSpontaneousEvent((QObject *)device,(QEvent *)&local_70);
    }
    bVar3 = QEvent::isAccepted(&local_70.super_QEvent);
    in_RDI->eventAccepted = bVar3;
  }
  else {
    QWindow::d_func((QWindow *)0x367696);
    pQVar5 = QWindowPrivate::forwardToPopup
                       ((QWindowPrivate *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        (QEvent *)in_RDI,device);
    if (pQVar5 == (QWindow *)0x0) goto LAB_003676c2;
  }
  QKeyEvent::~QKeyEvent(this);
LAB_00367716:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGuiApplicationPrivate::processKeyEvent(QWindowSystemInterfacePrivate::KeyEvent *e)
{
    QWindow *window = e->window.data();
    modifier_buttons = e->modifiers;
    if (e->nullWindow()
#ifdef Q_OS_ANDROID
           || e->key == Qt::Key_Back || e->key == Qt::Key_Menu
#endif
            ) {
        window = QGuiApplication::focusWindow();
    }

    if (!window) {
        e->eventAccepted = false;
        return;
    }

#if defined(Q_OS_ANDROID)
    static bool backKeyPressAccepted = false;
    static bool menuKeyPressAccepted = false;
#endif

#if !defined(Q_OS_MACOS)
    // FIXME: Include OS X in this code path by passing the key event through
    // QPlatformInputContext::filterEvent().
    if (e->keyType == QEvent::KeyPress) {
        if (QWindowSystemInterface::handleShortcutEvent(window, e->timestamp, e->key, e->modifiers,
            e->nativeScanCode, e->nativeVirtualKey, e->nativeModifiers, e->unicode, e->repeat, e->repeatCount)) {
#if defined(Q_OS_ANDROID)
            backKeyPressAccepted = e->key == Qt::Key_Back;
            menuKeyPressAccepted = e->key == Qt::Key_Menu;
#endif
            return;
        }
    }
#endif

    QKeyEvent ev(e->keyType, e->key, e->modifiers,
                 e->nativeScanCode, e->nativeVirtualKey, e->nativeModifiers,
                 e->unicode, e->repeat, e->repeatCount);
    ev.setTimestamp(e->timestamp);

    const auto *activePopup = activePopupWindow();
    if (activePopup && activePopup != window) {
        // If the popup handles the event, we're done.
        if (window->d_func()->forwardToPopup(&ev, active_popup_on_press))
            return;
    }

    // only deliver key events when we have a window, and no modal window is blocking this window

    if (!window->d_func()->blockedByModalWindow)
        QGuiApplication::sendSpontaneousEvent(window, &ev);
#ifdef Q_OS_ANDROID
    else
        ev.setAccepted(false);

    if (e->keyType == QEvent::KeyPress) {
        backKeyPressAccepted = e->key == Qt::Key_Back && ev.isAccepted();
        menuKeyPressAccepted = e->key == Qt::Key_Menu && ev.isAccepted();
    } else if (e->keyType == QEvent::KeyRelease) {
        if (e->key == Qt::Key_Back && !backKeyPressAccepted && !ev.isAccepted()) {
            if (window)
                QWindowSystemInterface::handleCloseEvent(window);
        } else if (e->key == Qt::Key_Menu && !menuKeyPressAccepted && !ev.isAccepted()) {
            platform_theme->showPlatformMenuBar();
        }
    }
#endif
    e->eventAccepted = ev.isAccepted();
}